

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

size_t __thiscall PSymbolTable::MarkSymbols(PSymbolTable *this)

{
  bool bVar1;
  size_t sVar2;
  Pair *pair;
  Iterator it;
  Pair *local_30;
  TMapIterator<FName,_PSymbol_*,_TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>_>
  local_28;
  
  local_28.Map = &this->Symbols;
  local_28.Position = 0;
  sVar2 = 0;
  while( true ) {
    bVar1 = TMapIterator<FName,_PSymbol_*,_TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>_>
            ::NextPair(&local_28,&local_30);
    if (!bVar1) break;
    GC::Mark<PSymbol>(&local_30->Value);
    sVar2 = sVar2 + 0x10;
  }
  return sVar2;
}

Assistant:

size_t PSymbolTable::MarkSymbols()
{
	size_t count = 0;
	MapType::Iterator it(Symbols);
	MapType::Pair *pair;

	while (it.NextPair(pair))
	{
		GC::Mark(pair->Value);
		count++;
	}
	return count * sizeof(*pair);
}